

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_hdr_looks_good(nifti_1_header *hdr)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char *__format;
  short *psVar6;
  
  iVar2 = need_nhdr_swap(hdr->dim[0],hdr->sizeof_hdr);
  iVar5 = 0;
  if ((iVar2 < 0) && (iVar5 = 1, 0 < g_opts_0)) {
    fprintf(_stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",(ulong)(uint)(int)hdr->dim[0],
            (ulong)(uint)hdr->sizeof_hdr);
  }
  if (0 < hdr->dim[0]) {
    psVar6 = hdr->dim;
    uVar4 = 1;
    do {
      psVar6 = psVar6 + 1;
      if (*psVar6 < 1) {
        if (0 < g_opts_0) {
          fprintf(_stderr,"** bad nhdr field: dim[%d] = %d\n",uVar4 & 0xffffffff);
        }
        iVar5 = iVar5 + 1;
      }
      if (6 < uVar4) break;
      bVar1 = (long)uVar4 < (long)hdr->dim[0];
      uVar4 = uVar4 + 1;
    } while (bVar1);
  }
  if ((((hdr->magic[0] == 'n') && (hdr->magic[3] == '\0')) &&
      ((hdr->magic[1] == 'i' || (hdr->magic[1] == '+')))) && ((byte)(hdr->magic[2] - 0x31U) < 9)) {
    if (hdr->datatype != 1) {
      uVar4 = 0x2b;
      do {
        uVar3 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar3;
        if (nifti_type_list[uVar4].type == (int)hdr->datatype) goto LAB_0010fce1;
      } while (1 < uVar3);
    }
    if (0 < g_opts_0) {
      __format = "** bad NIFTI datatype in hdr, %d\n";
LAB_0010fda1:
      fprintf(_stderr,__format);
    }
  }
  else {
    if (1 < g_opts_0) {
      fprintf(_stderr,"-- nhdr magic field implies ANALYZE: magic = \'%.4s\'\n",hdr->magic);
    }
    uVar3 = 0x2a;
    do {
      uVar4 = (ulong)uVar3;
      if (uVar3 < 2) break;
      uVar3 = uVar3 - 1;
    } while (nifti_type_list[uVar4].type != (int)hdr->datatype);
    if (nifti_type_list[uVar4].type == (int)hdr->datatype) goto LAB_0010fce1;
    if (0 < g_opts_0) {
      __format = "** bad ANALYZE datatype in hdr, %d\n";
      goto LAB_0010fda1;
    }
  }
  iVar5 = iVar5 + 1;
LAB_0010fce1:
  iVar2 = 0;
  if ((iVar5 == 0) && (iVar2 = 1, 2 < g_opts_0)) {
    nifti_hdr_looks_good_cold_1();
  }
  return iVar2;
}

Assistant:

int nifti_hdr_looks_good(const nifti_1_header * hdr)
{
   int is_nifti, c, errs = 0;

   /* check dim[0] and sizeof_hdr */
   if( need_nhdr_swap(hdr->dim[0], hdr->sizeof_hdr) < 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",
                 hdr->dim[0], hdr->sizeof_hdr);
      errs++;
   }

   /* check the valid dimension sizes (maybe dim[0] is bad) */
   for( c = 1; c <= hdr->dim[0] && c <= 7; c++ )
      if( hdr->dim[c] <= 0 ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad nhdr field: dim[%d] = %d\n",c,hdr->dim[c]);
         errs++;
      }

   is_nifti = NIFTI_VERSION(*hdr);      /* determine header type */

   if( is_nifti ){      /* NIFTI */

      if( ! nifti_datatype_is_valid(hdr->datatype, 1) ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad NIFTI datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }

   } else {             /* ANALYZE 7.5 */

      if( g_opts.debug > 1 )  /* maybe tell user it's an ANALYZE hdr */
         fprintf(stderr,
            "-- nhdr magic field implies ANALYZE: magic = '%.4s'\n",hdr->magic);

      if( ! nifti_datatype_is_valid(hdr->datatype, 0) ){
         if( g_opts.debug > 0 )
           fprintf(stderr,"** bad ANALYZE datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }
   }

   if( errs ) return 0;  /* problems */

   if( g_opts.debug > 2 ) fprintf(stderr,"-d nifti header looks good\n");

   return 1;   /* looks good */
}